

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferStream.hh
# Opt level: O0

void __thiscall avro::istream::~istream(istream *this,void **vtt)

{
  istreambuf *in_RSI;
  long *in_RDI;
  
  *in_RDI = *(long *)in_RSI;
  *(undefined8 *)((long)in_RDI + *(long *)(*in_RDI + -0x18)) = *(undefined8 *)&in_RSI->field_0x18;
  istreambuf::~istreambuf(in_RSI);
  std::istream::~istream(in_RDI);
  return;
}

Assistant:

class AVRO_DECL istream : public std::istream {

  public:

    /// Constructor, requires an InputBuffer to read from.
    explicit istream(const InputBuffer &buf) : 
        std::istream(&ibuf_), ibuf_(buf)
    { }

    /// Constructor, takes an OutputBuffer to read from (by making a shallow copy to an InputBuffer).
    /// Writing to the OutputBuffer while an istream is using it may lead to undefined behavior.
    explicit istream(const OutputBuffer &buf) : 
        std::istream(&ibuf_), ibuf_(buf)
    { }

    /// Return the InputBuffer this stream is reading from.
    const InputBuffer &getBuffer() const {
        return ibuf_.getBuffer();
    }

  protected:

    istreambuf ibuf_;
}